

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::
basic_bson_parser<jsoncons::bytes_source>
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          bytes_source *source,bson_decode_options *options,allocator<char> *temp_alloc)

{
  _func_int *p_Var1;
  value_type *pvVar2;
  int local_3c [3];
  
  (this->super_ser_context)._vptr_ser_context = (_func_int **)&PTR__basic_bson_parser_00b598e0;
  this->more_ = true;
  this->done_ = false;
  this->cursor_mode_ = false;
  this->mark_level_ = 0;
  pvVar2 = source->current_;
  (this->source_).data_ = source->data_;
  (this->source_).current_ = pvVar2;
  (this->source_).end_ = source->end_;
  p_Var1 = options->_vptr_bson_decode_options[-3];
  *(undefined ***)&(this->options_).field_0x8 = &PTR__bson_options_common_00b593e0;
  *(undefined4 *)&(this->options_).field_0x10 = *(undefined4 *)(&options->field_0x8 + (long)p_Var1);
  (this->options_)._vptr_bson_decode_options = (_func_int **)0xb596c0;
  *(undefined8 *)&(this->options_).field_0x8 = 0xb596e8;
  (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_buffer_)._M_dataplus._M_p = (pointer)&(this->name_buffer_).field_2;
  (this->name_buffer_)._M_string_length = 0;
  (this->name_buffer_).field_2._M_local_buf[0] = '\0';
  (this->text_buffer_)._M_dataplus._M_p = (pointer)&(this->text_buffer_).field_2;
  (this->text_buffer_)._M_string_length = 0;
  (this->text_buffer_).field_2._M_local_buf[0] = '\0';
  (this->state_stack_).
  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c[2] = 0;
  local_3c[1] = 0;
  local_3c[0] = 0;
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
             &this->state_stack_,(parse_mode *)(local_3c + 2),local_3c + 1,local_3c);
  return;
}

Assistant:

basic_bson_parser(Sourceable&& source,
                      const bson_decode_options& options = bson_decode_options(),
                      const TempAllocator& temp_alloc = TempAllocator())
       : source_(std::forward<Sourceable>(source)), 
         options_(options),
         bytes_buffer_(temp_alloc),
         name_buffer_(temp_alloc),
         text_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0,0);
    }